

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

int enter_atom_into_cache(atom_server as,send_get_atom_msg_ptr msg)

{
  undefined8 in_RAX;
  char *__ptr;
  undefined8 *__ptr_00;
  Tcl_HashEntry *pTVar1;
  int in_EDX;
  int iVar2;
  int new;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar2 = 0;
  if (in_EDX != -1 && msg != (send_get_atom_msg_ptr)0x0) {
    __ptr = strdup((char *)msg);
    __ptr_00 = (undefined8 *)malloc(0x10);
    *__ptr_00 = __ptr;
    *(int *)(__ptr_00 + 1) = in_EDX;
    pTVar1 = (*(as->string_hash_table).createProc)(&as->string_hash_table,__ptr,&local_34);
    if (local_34 == 0) {
      free(__ptr_00);
      free(__ptr);
      iVar2 = 0;
    }
    else {
      pTVar1->clientData = __ptr_00;
      pTVar1 = (*(as->value_hash_table).createProc)
                         (&as->value_hash_table,(char *)(long)in_EDX,&local_34);
      if (local_34 == 0) {
        puts("Serious internal error in atom cache.  Duplicate value hash entry.");
        exit(1);
      }
      pTVar1->clientData = __ptr_00;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static
int
enter_atom_into_cache(atom_server as, send_get_atom_msg_ptr msg)
{
    int new;
    char *str;
    send_get_atom_msg_ptr stored;
    Tcl_HashEntry *entry = NULL;

    if ((msg->atom_string == NULL) || (msg->atom == -1))
	return 0;
    str = strdup(msg->atom_string);
    stored = (send_get_atom_msg_ptr) malloc(sizeof(send_get_atom_msg));
    stored->atom_string = str;
    stored->atom = msg->atom;

    /* enter into string hash table */
    entry = Tcl_CreateHashEntry(&as->string_hash_table, str, &new);
    if (!new) {
	/* already inserted by someone else */
	free(stored);
	free(str);
	return 0;
    }
    Tcl_SetHashValue(entry, stored);
    /* enter into value hash table */
    entry = Tcl_CreateHashEntry(&as->value_hash_table,
				(char *) (int64_t) stored->atom, &new);
    if (!new) {
	printf("Serious internal error in atom cache.  Duplicate value hash entry.\n");
	exit(1);
    }
    Tcl_SetHashValue(entry, stored);
    return 1;
}